

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.h
# Opt level: O3

void llvm::yaml::skip<llvm::yaml::SequenceNode>(SequenceNode *C)

{
  iterator i;
  basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node> local_10;
  
  if (C->IsAtBeginning == false) {
    if (C->IsAtEnd == false) {
      __assert_fail("(C.IsAtBeginning || C.IsAtEnd) && \"Cannot skip mid parse!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                    ,0x187,
                    "void llvm::yaml::skip(CollectionType &) [CollectionType = llvm::yaml::SequenceNode]"
                   );
    }
  }
  else {
    local_10.Base = (SequenceNode *)begin<llvm::yaml::SequenceNode>(C);
    if (local_10.Base != (SequenceNode *)0x0) {
      do {
        if ((local_10.Base)->CurrentEntry == (Node *)0x0) {
          __assert_fail("Base && Base->CurrentEntry && \"Attempted to access end iterator!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/Support/YAMLParser.h"
                        ,0x14b,
                        "ValueT *llvm::yaml::basic_collection_iterator<llvm::yaml::SequenceNode, llvm::yaml::Node>::operator->() const [BaseT = llvm::yaml::SequenceNode, ValueT = llvm::yaml::Node]"
                       );
        }
        (*(local_10.Base)->CurrentEntry->_vptr_Node[1])();
        basic_collection_iterator<llvm::yaml::SequenceNode,_llvm::yaml::Node>::operator++(&local_10)
        ;
      } while (local_10.Base != (SequenceNode *)0x0);
    }
  }
  return;
}

Assistant:

void skip(CollectionType &C) {
  // TODO: support skipping from the middle of a parsed collection ;/
  assert((C.IsAtBeginning || C.IsAtEnd) && "Cannot skip mid parse!");
  if (C.IsAtBeginning)
    for (typename CollectionType::iterator i = begin(C), e = C.end(); i != e;
         ++i)
      i->skip();
}